

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::Header::setType(Header *this,string *type)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  Attribute *in_stack_00000440;
  char *in_stack_00000448;
  Header *in_stack_00000450;
  string *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  
  bVar1 = isSupportedType(in_stack_fffffffffffffe60);
  if (bVar1) {
    this_00 = (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&stack0xfffffffffffffe78;
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::TypedAttribute(in_RDI,in_stack_fffffffffffffe68);
    insert(in_stack_00000450,in_stack_00000448,in_stack_00000440);
    TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~TypedAttribute(this_00);
    bVar1 = isDeepData((string *)this_00);
    if ((bVar1) && (bVar1 = hasVersion((Header *)0x12e5f3), !bVar1)) {
      setVersion((Header *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    }
    return;
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x48);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                 in_stack_fffffffffffffe80);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
  std::operator+(__lhs,in_stack_fffffffffffffe60);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
  std::operator+(__lhs,in_stack_fffffffffffffe60);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
  std::operator+(__lhs,in_stack_fffffffffffffe60);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
  std::operator+(__lhs,in_stack_fffffffffffffe60);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffe60);
  Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  __cxa_throw(__lhs,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
Header::setType (const string& type)
{
    if (isSupportedType (type) == false)
    {
        throw IEX_NAMESPACE::ArgExc (
            type + "is not a supported image type." +
            "The following are supported: " + SCANLINEIMAGE + ", " +
            TILEDIMAGE + ", " + DEEPSCANLINE + " or " + DEEPTILE + ".");
    }

    insert ("type", StringAttribute (type));

    // (TODO) Should we do it here?
    if (isDeepData (type) && hasVersion () == false) { setVersion (1); }
}